

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

int ov_test(FILE *f,OggVorbis_File *vf,char *initial,long ibytes)

{
  ov_callbacks callbacks;
  int iVar1;
  
  callbacks.seek_func = _fseek64_wrap;
  callbacks.read_func = fread;
  callbacks.close_func = fclose;
  callbacks.tell_func = ftell;
  iVar1 = _ov_open1(f,vf,initial,ibytes,callbacks);
  return iVar1;
}

Assistant:

int ov_test(FILE *f,OggVorbis_File *vf,const char *initial,long ibytes){
  ov_callbacks callbacks = {
    (size_t (*)(void *, size_t, size_t, void *))  fread,
    (int (*)(void *, ogg_int64_t, int))              _fseek64_wrap,
    (int (*)(void *))                             fclose,
    (long (*)(void *))                            ftell
  };

  return ov_test_callbacks((void *)f, vf, initial, ibytes, callbacks);
}